

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax
          (UnarySelectPropertyExprSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  UnaryAssertionOperator op_00;
  SequenceRange *pSVar2;
  PropertyExprSyntax *pPVar3;
  UnaryAssertionExpr *pUVar4;
  long in_RDI;
  AssertionExpr *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bool allowUnbounded;
  optional<slang::ast::SequenceRange> range;
  UnaryAssertionOperator op;
  Compilation *comp;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  optional<slang::ast::SequenceRange> *in_stack_ffffffffffffff50;
  UnaryAssertionOperator *in_stack_ffffffffffffff58;
  BumpAllocator *in_stack_ffffffffffffff60;
  bitmask<slang::ast::ASTFlags> local_68;
  undefined7 local_60;
  undefined1 in_stack_ffffffffffffffa7;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  SelectorSyntax *in_stack_ffffffffffffffb0;
  
  ASTContext::getCompilation((ASTContext *)0x9b1cd4);
  op_00 = getUnaryOp(*(TokenKind *)(in_RDI + 0x18));
  std::optional<slang::ast::SequenceRange>::optional
            ((optional<slang::ast::SequenceRange> *)0x9b1d01);
  if (*(long *)(in_RDI + 0x38) != 0) {
    in_stack_ffffffffffffff4f = op_00 == Always || op_00 == SEventually;
    SequenceRange::fromSyntax
              (in_stack_ffffffffffffffb0,(ASTContext *)in_stack_ffffffffffffffa8.m_bits,
               (bool)in_stack_ffffffffffffffa7);
    std::optional<slang::ast::SequenceRange>::operator=
              (in_stack_ffffffffffffff50,
               (SequenceRange *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  }
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffa8);
  if ((((op_00 == Always) || (op_00 == NextTime)) || (op_00 == Eventually)) &&
     ((bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9b1dd5)
      , bVar1 &&
      (pSVar2 = std::optional<slang::ast::SequenceRange>::operator->
                          ((optional<slang::ast::SequenceRange> *)0x9b1de8), pSVar2->min != 0)))) {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&local_60,PropertyTimeAdvance);
    in_stack_ffffffffffffffa8.m_bits = (underlying_type)CONCAT17(in_stack_ffffffffffffffa7,local_60)
    ;
  }
  else {
    bVar1 = isNegationOp(op_00);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_68,PropertyNegation);
      in_stack_ffffffffffffffa8.m_bits = local_68.m_bits;
    }
  }
  pPVar3 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9b1e46);
  ASTContext::resetFlags
            ((ASTContext *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffffa8);
  AssertionExpr::bind((int)pPVar3,(sockaddr *)&stack0xffffffffffffff58,0);
  pUVar4 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      (AssertionExpr *)in_stack_ffffffffffffffa8.m_bits,
                      (optional<slang::ast::SequenceRange> *)
                      CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  return &pUVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnarySelectPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto op = getUnaryOp(syntax.op.kind);

    std::optional<SequenceRange> range;
    if (syntax.selector) {
        bool allowUnbounded = op == UnaryAssertionOperator::Always ||
                              op == UnaryAssertionOperator::SEventually;
        range = SequenceRange::fromSyntax(*syntax.selector, context, allowUnbounded);
    }

    bitmask<ASTFlags> extraFlags;
    if ((op == UnaryAssertionOperator::Always || op == UnaryAssertionOperator::NextTime ||
         op == UnaryAssertionOperator::Eventually) &&
        range && range->min > 0) {
        extraFlags = ASTFlags::PropertyTimeAdvance;
    }
    else if (isNegationOp(op)) {
        extraFlags = ASTFlags::PropertyNegation;
    }

    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));

    return *comp.emplace<UnaryAssertionExpr>(op, expr, range);
}